

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O2

void __thiscall xmrig::FailoverStrategy::add(FailoverStrategy *this,Pool *pool)

{
  IClient *pIVar1;
  IClient *client;
  IClient *local_28;
  
  pIVar1 = Pool::createClient(pool,(int)((ulong)((long)(this->m_pools).
                                                                                                              
                                                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->m_pools).
                                                                                                            
                                                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                              &this->super_IClientListener);
  local_28 = pIVar1;
  (*pIVar1->_vptr_IClient[0x17])(pIVar1,(ulong)(uint)this->m_retries);
  (*pIVar1->_vptr_IClient[0x18])(pIVar1,(long)this->m_retryPause * 1000);
  (*pIVar1->_vptr_IClient[0x16])(pIVar1,(ulong)this->m_quiet);
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::push_back
            (&this->m_pools,&local_28);
  return;
}

Assistant:

void xmrig::FailoverStrategy::add(const Pool &pool)
{
    IClient *client = pool.createClient(static_cast<int>(m_pools.size()), this);

    client->setRetries(m_retries);
    client->setRetryPause(m_retryPause * 1000);
    client->setQuiet(m_quiet);

    m_pools.push_back(client);
}